

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_227::FunctionOptimizer::FunctionOptimizer
          (FunctionOptimizer *this,PCVStructValuesMap *infos)

{
  PCVStructValuesMap *infos_local;
  FunctionOptimizer *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionOptimizer_02716668;
  this->infos = infos;
  this->changed = false;
  return;
}

Assistant:

FunctionOptimizer(PCVStructValuesMap& infos) : infos(infos) {}